

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_seed_tree(REF_INTERP ref_interp)

{
  REF_MPI pRVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_NODE pRVar4;
  REF_SEARCH ref_search;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  uint uVar7;
  REF_STATUS RVar8;
  uint uVar9;
  int iVar10;
  void *my_array;
  void *my_array_00;
  double *pdVar11;
  REF_INT *pRVar12;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  undefined8 *puVar16;
  ulong uVar17;
  long lVar18;
  void *pvVar19;
  char *pcVar20;
  size_t sVar21;
  double dVar22;
  REF_DBL RVar23;
  uint local_190;
  REF_INT total_node;
  REF_MPI local_178;
  REF_CELL local_170;
  REF_INT *local_168;
  double *local_160;
  void *local_158;
  void *local_150;
  REF_INT *local_148;
  REF_INT nrecv;
  REF_NODE local_138;
  REF_INT *source;
  REF_DBL *global_xyz;
  REF_LIST ref_list;
  void *local_118;
  double *local_110;
  REF_INT *local_108;
  void *local_100;
  uint local_f8;
  uint local_f4;
  REF_DBL *recv_bary;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  REF_DBL bary [4];
  REF_INT nodes [27];
  
  pRVar1 = ref_interp->ref_mpi;
  pRVar2 = ref_interp->from_grid->node;
  pRVar3 = ref_interp->from_tet;
  pRVar4 = ref_interp->to_grid->node;
  ref_search = ref_interp->ref_search;
  uVar7 = ref_list_create(&ref_list);
  if (uVar7 != 0) {
    pcVar20 = "create list";
    uVar13 = 0x60f;
LAB_00121249:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar13
           ,"ref_interp_seed_tree",(ulong)uVar7,pcVar20);
    return uVar7;
  }
  if ((long)pRVar4->max < 1) {
    uVar7 = 0;
  }
  else {
    lVar14 = 0;
    uVar7 = 0;
    do {
      if ((-1 < pRVar4->global[lVar14]) && (pRVar4->ref_mpi->id == pRVar4->part[lVar14])) {
        uVar7 = uVar7 + (ref_interp->cell[lVar14] == -1);
      }
      lVar14 = lVar14 + 1;
    } while (pRVar4->max != lVar14);
  }
  local_170 = pRVar3;
  if ((int)uVar7 < 0) {
    pcVar20 = "malloc local_node of REF_INT negative";
    uVar13 = 0x617;
LAB_001213a8:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar13
           ,"ref_interp_seed_tree",pcVar20);
    RVar8 = 1;
  }
  else {
    local_138 = pRVar2;
    my_array = malloc((ulong)uVar7 << 2);
    if (my_array == (void *)0x0) {
      pcVar20 = "malloc local_node of REF_INT NULL";
      uVar13 = 0x617;
    }
    else {
      my_array_00 = malloc((ulong)(uVar7 * 3) << 3);
      if (my_array_00 == (void *)0x0) {
        pcVar20 = "malloc local_xyz of REF_DBL NULL";
        uVar13 = 0x618;
      }
      else {
        if (pRVar4->max < 1) {
          uVar7 = 0;
        }
        else {
          pRVar5 = pRVar4->global;
          lVar14 = 0;
          lVar15 = 2;
          uVar7 = 0;
          do {
            if (((-1 < pRVar5[lVar14]) && (pRVar4->ref_mpi->id == pRVar4->part[lVar14])) &&
               (ref_interp->cell[lVar14] == -1)) {
              *(int *)((long)my_array + (long)(int)uVar7 * 4) = (int)lVar14;
              pRVar6 = pRVar4->real;
              lVar18 = (long)(int)(uVar7 * 3);
              *(REF_DBL *)((long)my_array_00 + lVar18 * 8) = pRVar6[lVar15 + -2];
              *(REF_DBL *)((long)my_array_00 + lVar18 * 8 + 8) = pRVar6[lVar15 + -1];
              *(REF_DBL *)((long)my_array_00 + lVar18 * 8 + 0x10) = pRVar6[lVar15];
              uVar7 = uVar7 + 1;
            }
            lVar14 = lVar14 + 1;
            lVar15 = lVar15 + 0xf;
          } while (lVar14 < pRVar4->max);
        }
        if (0 < (int)uVar7) {
          uVar9 = 10;
          if (10 < uVar7 / 100) {
            uVar9 = uVar7 / 100;
          }
          if ((int)uVar7 <= (int)uVar9) {
            uVar9 = uVar7;
          }
          uVar17 = 100;
          if ((int)uVar9 < 100) {
            uVar17 = (ulong)uVar9;
          }
          lVar14 = 0;
          puVar16 = (undefined8 *)((long)my_array_00 + 0x10);
          lVar15 = 0;
          do {
            *(undefined4 *)((long)my_array + lVar14 * 4) =
                 *(undefined4 *)((long)my_array + lVar15 * 4);
            puVar16[-2] = *(undefined8 *)((long)my_array_00 + lVar15 * 0x18);
            puVar16[-1] = *(undefined8 *)((long)my_array_00 + lVar15 * 0x18 + 8);
            *puVar16 = *(undefined8 *)((long)my_array_00 + lVar15 * 0x18 + 0x10);
            lVar14 = lVar14 + 1;
            lVar15 = lVar15 + (ulong)((int)(uVar7 / uVar17) + 1);
            puVar16 = puVar16 + 3;
          } while ((int)lVar15 < (int)uVar7);
          uVar7 = (uint)lVar14;
        }
        local_178 = pRVar1;
        uVar9 = ref_mpi_allconcat(pRVar1,3,uVar7,my_array_00,&total_node,&source,&global_xyz,3);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x639,"ref_interp_seed_tree",(ulong)uVar9,"cat");
          return uVar9;
        }
        if (source != (REF_INT *)0x0) {
          free(source);
        }
        uVar7 = ref_mpi_allconcat(local_178,1,uVar7,my_array,&total_node,&source,&global_node,1);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x63d,"ref_interp_seed_tree",(ulong)uVar7,"cat");
          return uVar7;
        }
        lVar14 = (long)total_node;
        if (lVar14 < 0) {
          pcVar20 = "malloc best_bary of REF_DBL negative";
          uVar13 = 0x63f;
          goto LAB_001213a8;
        }
        pdVar11 = (double *)malloc(lVar14 * 8);
        if (pdVar11 == (double *)0x0) {
          pcVar20 = "malloc best_bary of REF_DBL NULL";
          uVar13 = 0x63f;
        }
        else {
          sVar21 = lVar14 << 2;
          local_100 = malloc(sVar21);
          if (local_100 == (void *)0x0) {
            pcVar20 = "malloc best_node of REF_INT NULL";
            uVar13 = 0x640;
          }
          else {
            pRVar12 = (REF_INT *)malloc(sVar21);
            if (pRVar12 == (REF_INT *)0x0) {
              pcVar20 = "malloc best_cell of REF_INT NULL";
              uVar13 = 0x641;
            }
            else {
              local_108 = pRVar12;
              pRVar12 = (REF_INT *)malloc(sVar21);
              if (pRVar12 == (REF_INT *)0x0) {
                pcVar20 = "malloc from_proc of REF_INT NULL";
                uVar13 = 0x642;
              }
              else {
                local_148 = pRVar12;
                local_110 = pdVar11;
                if (0 < total_node) {
                  pvVar19 = (void *)0x0;
                  lVar14 = 0;
                  pRVar12 = local_108;
                  do {
                    *(REF_INT *)((long)local_100 + lVar14 * 4) = global_node[lVar14];
                    *pRVar12 = -1;
                    *pdVar11 = 1e+20;
                    local_160 = pdVar11;
                    local_158 = pvVar19;
                    uVar7 = ref_search_touching(ref_search,ref_list,
                                                (REF_DBL *)((long)global_xyz + (long)pvVar19),
                                                ref_interp->search_fuzz);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x649,"ref_interp_seed_tree",(ulong)uVar7,"tch");
                      return uVar7;
                    }
                    if (ref_list->n < 1) {
                      *pRVar12 = -1;
                    }
                    else {
                      uVar7 = ref_interp_enclosing_tet_in_list
                                        (ref_interp,ref_list,
                                         (REF_DBL *)((long)global_xyz + (long)local_158),pRVar12,
                                         bary);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x64e,"ref_interp_seed_tree",(ulong)uVar7,"best in list");
                        return uVar7;
                      }
                      if (*pRVar12 != -1) {
                        dVar22 = bary[0];
                        if (bary[1] <= bary[0]) {
                          dVar22 = bary[1];
                        }
                        RVar23 = bary[2];
                        if (bary[3] <= bary[2]) {
                          RVar23 = bary[3];
                        }
                        if (RVar23 <= dVar22) {
                          dVar22 = RVar23;
                        }
                        *local_160 = -dVar22;
                      }
                    }
                    ref_interp->tree_cells = ref_interp->tree_cells + ref_list->n;
                    uVar7 = ref_list_erase(ref_list);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x657,"ref_interp_seed_tree",(ulong)uVar7,"reset list");
                      return uVar7;
                    }
                    lVar14 = lVar14 + 1;
                    pvVar19 = (void *)((long)local_158 + 0x18);
                    pdVar11 = local_160 + 1;
                    pRVar12 = pRVar12 + 1;
                  } while (lVar14 < total_node);
                }
                pRVar1 = local_178;
                uVar7 = ref_mpi_allminwho(local_178,local_110,local_148,total_node);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x65b,"ref_interp_seed_tree",(ulong)uVar7,"who");
                  return uVar7;
                }
                if ((long)total_node < 1) {
                  uVar7 = 0;
                }
                else {
                  lVar14 = 0;
                  uVar7 = 0;
                  do {
                    uVar7 = uVar7 + (pRVar1->id == local_148[lVar14]);
                    lVar14 = lVar14 + 1;
                  } while (total_node != lVar14);
                }
                if ((int)uVar7 < 0) {
                  pcVar20 = "malloc send_bary of REF_DBL negative";
                  uVar13 = 0x661;
                  goto LAB_001213a8;
                }
                local_158 = malloc((ulong)(uVar7 * 4) << 3);
                if (local_158 == (void *)0x0) {
                  pcVar20 = "malloc send_bary of REF_DBL NULL";
                  uVar13 = 0x661;
                }
                else {
                  sVar21 = (ulong)uVar7 * 4;
                  local_160 = (double *)malloc(sVar21);
                  if (local_160 == (double *)0x0) {
                    pcVar20 = "malloc send_cell of REF_INT NULL";
                    uVar13 = 0x662;
                  }
                  else {
                    local_118 = malloc(sVar21);
                    if (local_118 == (void *)0x0) {
                      pcVar20 = "malloc send_node of REF_INT NULL";
                      uVar13 = 0x663;
                    }
                    else {
                      local_168 = (REF_INT *)malloc(sVar21);
                      if (local_168 != (REF_INT *)0x0) {
                        pvVar19 = malloc(sVar21);
                        if (pvVar19 == (void *)0x0) {
                          local_150 = (void *)0x0;
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x665,"ref_interp_seed_tree","malloc my_proc of REF_INT NULL");
                          local_190 = 2;
                        }
                        else {
                          local_190 = 0;
                          local_150 = pvVar19;
                          if (uVar7 != 0) {
                            uVar17 = 0;
                            do {
                              *(REF_INT *)((long)pvVar19 + uVar17 * 4) = local_178->id;
                              uVar17 = uVar17 + 1;
                            } while (uVar7 != uVar17);
                          }
                        }
                        if (pvVar19 == (void *)0x0) {
                          return local_190;
                        }
                        if (total_node < 1) {
                          iVar10 = 0;
                        }
                        else {
                          lVar15 = 0;
                          lVar14 = 0;
                          iVar10 = 0;
                          pRVar12 = local_148;
                          do {
                            if (local_178->id == pRVar12[lVar14]) {
                              lVar18 = (long)iVar10;
                              local_168[lVar18] = source[lVar14];
                              uVar7 = *(uint *)((long)local_100 + lVar14 * 4);
                              *(uint *)((long)local_118 + lVar18 * 4) = uVar7;
                              uVar9 = local_108[lVar14];
                              *(uint *)((long)local_160 + lVar18 * 4) = uVar9;
                              if (uVar9 != 0xffffffff) {
                                local_f4 = uVar9;
                                uVar9 = ref_cell_nodes(local_170,uVar9,nodes);
                                if (uVar9 != 0) {
                                  local_f8 = uVar9;
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x671,"ref_interp_seed_tree",(ulong)uVar9,
                                         "cell should be set and valid");
                                  printf("global %d best cell %d best bary %e\n",local_110[lVar14],
                                         (ulong)uVar7,(ulong)local_f4);
                                  local_190 = local_f8;
                                  uVar9 = local_f8;
                                }
                                if (uVar9 != 0) {
                                  return local_190;
                                }
                                uVar7 = ref_node_bary4(local_138,nodes,
                                                       (REF_DBL *)((long)global_xyz + lVar15),
                                                       (REF_DBL *)
                                                       ((long)local_158 + (long)(iVar10 * 4) * 8));
                                if (uVar7 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x674,"ref_interp_seed_tree",(ulong)uVar7,"bary");
                                  return uVar7;
                                }
                              }
                              local_190 = 0;
                              iVar10 = iVar10 + 1;
                              pRVar12 = local_148;
                            }
                            lVar14 = lVar14 + 1;
                            lVar15 = lVar15 + 0x18;
                          } while (lVar14 < total_node);
                        }
                        uVar7 = ref_mpi_blindsend(local_178,local_168,local_118,1,iVar10,&recv_node,
                                                  &nrecv,1);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x67b,"ref_interp_seed_tree",(ulong)uVar7,"blind send node");
                          return uVar7;
                        }
                        uVar7 = ref_mpi_blindsend(local_178,local_168,local_160,1,iVar10,&recv_cell,
                                                  &nrecv,1);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x67e,"ref_interp_seed_tree",(ulong)uVar7,"blind send cell");
                          return uVar7;
                        }
                        uVar7 = ref_mpi_blindsend(local_178,local_168,local_150,1,iVar10,&recv_proc,
                                                  &nrecv,1);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x681,"ref_interp_seed_tree",(ulong)uVar7,"blind send proc");
                          return uVar7;
                        }
                        uVar7 = ref_mpi_blindsend(local_178,local_168,local_158,4,iVar10,&recv_bary,
                                                  &nrecv,3);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x684,"ref_interp_seed_tree",(ulong)uVar7,"blind send bary");
                          return uVar7;
                        }
                        if (0 < nrecv) {
                          local_138 = (REF_NODE)0x0;
                          lVar14 = 0;
                          do {
                            ref_interp->n_tree = ref_interp->n_tree + 1;
                            local_170 = (REF_CELL)(long)recv_node[lVar14];
                            iVar10 = ref_interp->cell[(long)local_170];
                            if ((long)iVar10 != -1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x689,"ref_interp_seed_tree","tree already found?",
                                     0xffffffffffffffff,(long)iVar10);
                              local_190 = 1;
                            }
                            if (iVar10 != -1) {
                              return local_190;
                            }
                            if (ref_interp->agent_hired[(long)local_170] != 0) {
                              uVar7 = ref_agents_delete(ref_interp->ref_agents,(REF_INT)local_170);
                              if (uVar7 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x68b,"ref_interp_seed_tree",(ulong)uVar7,"deq");
                                return uVar7;
                              }
                              ref_interp->agent_hired[(long)local_170] = 0;
                            }
                            ref_interp->cell[(long)local_170] = recv_cell[lVar14];
                            ref_interp->part[(long)local_170] = recv_proc[lVar14];
                            if (recv_cell[lVar14] == -1) {
                              ref_interp->n_tree = ref_interp->n_tree + -1;
                            }
                            else {
                              pRVar6 = ref_interp->bary;
                              lVar15 = 0;
                              do {
                                pRVar6[(int)local_170 * 4 + lVar15] =
                                     *(REF_DBL *)((long)recv_bary + lVar15 * 8 + (long)local_138);
                                lVar15 = lVar15 + 1;
                              } while (lVar15 != 4);
                              uVar7 = ref_interp_push_onto_queue(ref_interp,(int)local_170);
                              if (uVar7 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x693,"ref_interp_seed_tree",(ulong)uVar7,"queue neighbors")
                                ;
                                return uVar7;
                              }
                            }
                            local_190 = 0;
                            lVar14 = lVar14 + 1;
                            local_138 = (REF_NODE)((long)local_138 + 0x20);
                          } while (lVar14 < nrecv);
                        }
                        if (recv_node != (REF_INT *)0x0) {
                          free(recv_node);
                        }
                        if (recv_cell != (REF_INT *)0x0) {
                          free(recv_cell);
                        }
                        if (recv_proc != (REF_INT *)0x0) {
                          free(recv_proc);
                        }
                        if (recv_bary != (REF_DBL *)0x0) {
                          free(recv_bary);
                        }
                        free(local_158);
                        if (local_150 != (void *)0x0) {
                          free(local_150);
                        }
                        free(local_160);
                        free(local_118);
                        free(local_168);
                        free(local_148);
                        free(local_108);
                        free(local_100);
                        free(local_110);
                        if (source != (REF_INT *)0x0) {
                          free(source);
                        }
                        if (global_node != (REF_INT *)0x0) {
                          free(global_node);
                        }
                        if (global_xyz != (REF_DBL *)0x0) {
                          free(global_xyz);
                        }
                        free(my_array_00);
                        free(my_array);
                        uVar7 = ref_list_free(ref_list);
                        if (uVar7 == 0) {
                          return 0;
                        }
                        pcVar20 = "free list";
                        uVar13 = 0x6af;
                        goto LAB_00121249;
                      }
                      pcVar20 = "malloc send_proc of REF_INT NULL";
                      uVar13 = 0x664;
                      local_168 = (REF_INT *)0x0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar13
           ,"ref_interp_seed_tree",pcVar20);
    RVar8 = 2;
  }
  return RVar8;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_seed_tree(REF_INTERP ref_interp) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_tet = ref_interp_from_tet(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_SEARCH ref_search = ref_interp_search(ref_interp);
  REF_DBL bary[4];
  REF_LIST ref_list;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, *best_node, *best_cell, *from_proc;
  REF_DBL *best_bary;
  REF_INT ntarget, seed_target, stride;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT *source, total_node;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;
  REF_INT i, item;

  RSS(ref_list_create(&ref_list), "create list");

  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    ntarget++;
  }
  ref_malloc(local_node, ntarget, REF_INT);
  ref_malloc(local_xyz, 3 * ntarget, REF_DBL);
  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    local_node[ntarget] = node;
    local_xyz[0 + 3 * ntarget] = ref_node_xyz(to_node, 0, node);
    local_xyz[1 + 3 * ntarget] = ref_node_xyz(to_node, 1, node);
    local_xyz[2 + 3 * ntarget] = ref_node_xyz(to_node, 2, node);
    ntarget++;
  }

  /* use approximately 1 percent of existing targets sampled uniformly,
     between 10 or 100, less than or equal ntarget */
  seed_target = ntarget / 100;
  seed_target = MAX(seed_target, 10);
  seed_target = MIN(seed_target, 100);
  seed_target = MIN(seed_target, ntarget);
  if (seed_target > 0) {
    stride = 1 + ntarget / seed_target;
    seed_target = 0;
    for (node = 0; node < ntarget; node += stride) {
      local_node[seed_target] = local_node[node];
      local_xyz[0 + 3 * seed_target] = local_xyz[0 + 3 * node];
      local_xyz[1 + 3 * seed_target] = local_xyz[1 + 3 * node];
      local_xyz[2 + 3 * seed_target] = local_xyz[2 + 3 * node];
      seed_target++;
    }
    ntarget = seed_target;
  }

  RSS(ref_mpi_allconcat(ref_mpi, 3, ntarget, (void *)local_xyz, &total_node,
                        &source, (void **)&global_xyz, REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ntarget, (void *)local_node, &total_node,
                        &source, (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_bary, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(best_cell, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (node = 0; node < total_node; node++) {
    best_node[node] = global_node[node];
    best_cell[node] = REF_EMPTY;
    best_bary[node] = 1.0e20; /* negative for min, until use max*/
    RSS(ref_search_touching(ref_search, ref_list, &(global_xyz[3 * node]),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      RSS(ref_interp_enclosing_tet_in_list(ref_interp, ref_list,
                                           &(global_xyz[3 * node]),
                                           &(best_cell[node]), bary),
          "best in list");
      if (REF_EMPTY != best_cell[node]) {
        /* negative for min, until use max*/
        best_bary[node] = -MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
      }
    } else {
      best_cell[node] = REF_EMPTY;
    }
    (ref_interp->tree_cells) += ref_list_n(ref_list);
    RSS(ref_list_erase(ref_list), "reset list");
  }

  /* negative for min, until use max*/
  RSS(ref_mpi_allminwho(ref_mpi, best_bary, from_proc, total_node), "who");

  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));
  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) {
      send_proc[nsend] = source[node];
      send_node[nsend] = best_node[node];
      send_cell[nsend] = best_cell[node];
      if (REF_EMPTY != send_cell[nsend]) {
        RSB(ref_cell_nodes(from_tet, best_cell[node], nodes),
            "cell should be set and valid", {
              printf("global %d best cell %d best bary %e\n", best_node[node],
                     best_cell[node], best_bary[node]);
            });
        RSS(ref_node_bary4(from_node, nodes, &(global_xyz[3 * node]),
                           &(send_bary[4 * nsend])),
            "bary");
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (item = 0; item < nrecv; item++) {
    (ref_interp->n_tree)++;
    node = recv_node[item];
    REIS(REF_EMPTY, ref_interp->cell[node], "tree already found?");
    if (ref_interp->agent_hired[node]) { /* need to dequeue */
      RSS(ref_agents_delete(ref_interp->ref_agents, node), "deq");
      ref_interp->agent_hired[node] = REF_FALSE;
    }
    ref_interp->cell[node] = recv_cell[item];
    ref_interp->part[node] = recv_proc[item];
    if (REF_EMPTY != recv_cell[item]) {
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * node] = recv_bary[i + 4 * item];
      RSS(ref_interp_push_onto_queue(ref_interp, node), "queue neighbors");
    } else {
      (ref_interp->n_tree)--;
    }
  }

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_cell);
  ref_free(best_node);
  ref_free(best_bary);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);

  RSS(ref_list_free(ref_list), "free list");

  return REF_SUCCESS;
}